

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall glcts::AdvancedUsageMultiStage::Run(AdvancedUsageMultiStage *this)

{
  bool bVar1;
  GLuint GVar2;
  size_type sVar3;
  reference data_00;
  Vector<unsigned_int,_4> *local_590;
  Vector<unsigned_int,_4> local_554;
  Vector<unsigned_int,_4> local_544;
  Vector<unsigned_int,_4> local_534;
  undefined4 local_524;
  Vector<unsigned_int,_4> local_520;
  Vector<unsigned_int,_4> local_510;
  Vector<unsigned_int,_4> local_500;
  uint *local_4f0;
  GLuint *data2;
  UVec4 data [67];
  GLenum draw_buffers [2];
  int i;
  int s;
  undefined1 local_a0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> init_data;
  char *xfb_var [2];
  char *src_fs;
  char *src_vs;
  allocator<char> local_49;
  string local_48;
  int local_28;
  int local_24;
  GLint p4;
  GLint p3;
  GLint p2;
  GLint p1;
  AdvancedUsageMultiStage *this_local;
  
  _p2 = this;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92cc,&p3);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92d2,&p4);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92d0,&local_24);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92d6,&local_28);
  if ((((p3 < 8) || (p4 < 2)) || (local_24 < 8)) || (local_28 < 2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,
               "GL_MAX_FRAGMENT/VERTEX_ATOMIC_COUNTER_BUFFERS orGL_MAX_FRAGMENT/VERTEX_ATOMIC_COUNTERS are less than required"
               ,&local_49);
    deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local = (AdvancedUsageMultiStage *)0x10;
  }
  else {
    GVar2 = glcts::anon_unknown_0::SACSubcaseBase::CreateProgram
                      (&this->super_SACSubcaseBase,
                       "#version 310 es\nlayout(location = 0) in vec4 i_vertex;\nflat out uint o_atomic_inc;\nflat out uint o_atomic_dec;\nlayout(binding = 1, offset = 16) uniform atomic_uint ac_counter_inc;\nlayout(binding = 7, offset = 128) uniform atomic_uint ac_counter_dec;\nvoid main() {\n  gl_Position = i_vertex;\n  o_atomic_inc = atomicCounterIncrement(ac_counter_inc);\n  o_atomic_dec = atomicCounterDecrement(ac_counter_dec);\n}"
                       ,
                       "#version 310 es\nlayout(location = 0) out uvec4 o_color[2];\nlayout(binding = 1, offset = 16) uniform atomic_uint ac_counter_inc;\nlayout(binding = 7, offset = 128) uniform atomic_uint ac_counter_dec;\nvoid main() {\n  o_color[0] = uvec4(atomicCounterIncrement(ac_counter_inc));\n  o_color[1] = uvec4(atomicCounterDecrement(ac_counter_dec));\n}"
                       ,false);
    this->prog_ = GVar2;
    init_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_16e489;
    glu::CallLogWrapper::glTransformFeedbackVaryings
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               this->prog_,2,
               (GLchar **)
               &init_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x8c8d);
    glcts::anon_unknown_0::SACSubcaseBase::LinkProgram(&this->super_SACSubcaseBase,this->prog_);
    s = 100;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&i + 3));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0,0x100,
               (value_type_conflict4 *)&s,(allocator<unsigned_int> *)((long)&i + 3));
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&i + 3));
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               1,&this->counter_buffer_);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0,this->counter_buffer_);
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0);
    data_00 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0,sVar3 << 2,data_00,0x88ea);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0,0);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               2,this->xfb_buffer_);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8c8e,this->xfb_buffer_[0]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8c8e,1000,(void *)0x0,0x88e2);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8c8e,this->xfb_buffer_[1]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8c8e,1000,(void *)0x0,0x88e2);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8c8e,0);
    glu::CallLogWrapper::glGenTextures
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               2,this->rt_);
    for (draw_buffers[0] = 0; (int)draw_buffers[0] < 2; draw_buffers[0] = draw_buffers[0] + 1) {
      glu::CallLogWrapper::glBindTexture
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,this->rt_[(int)draw_buffers[0]]);
      glu::CallLogWrapper::glTexParameteri
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,0x2800,0x2600);
      glu::CallLogWrapper::glTexImage2D
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,0,0x8236,8,8,0,0x8d94,0x1405,(void *)0x0);
      glu::CallLogWrapper::glBindTexture
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,0);
    }
    glu::CallLogWrapper::glGenFramebuffers
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               1,&this->fbo_);
    glu::CallLogWrapper::glBindFramebuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8d40,this->fbo_);
    glu::CallLogWrapper::glFramebufferTexture2D
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8d40,0x8ce0,0xde1,this->rt_[0],0);
    glu::CallLogWrapper::glFramebufferTexture2D
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8d40,0x8ce1,0xde1,this->rt_[1],0);
    data[0x42].m_data[2] = 0x8ce0;
    data[0x42].m_data[3] = 0x8ce1;
    glu::CallLogWrapper::glDrawBuffers
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               2,data[0x42].m_data + 2);
    glu::CallLogWrapper::glBindFramebuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8d40,0);
    glcts::anon_unknown_0::SACSubcaseBase::CreateTriangle
              (&this->super_SACSubcaseBase,&this->vao_,&this->vbo_,(GLuint *)0x0);
    glu::CallLogWrapper::glBindBufferRange
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0,1,this->counter_buffer_,0x10,0x20);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0,7,this->counter_buffer_);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8c8e,0,this->xfb_buffer_[0]);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8c8e,1,this->xfb_buffer_[1]);
    glu::CallLogWrapper::glBindFramebuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8d40,this->fbo_);
    glu::CallLogWrapper::glViewport
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0,0,8,8);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               this->prog_);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               this->vao_);
    glu::CallLogWrapper::glBeginTransformFeedback
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               4);
    glu::CallLogWrapper::glDrawArrays
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               4,0,3);
    glu::CallLogWrapper::glEndTransformFeedback
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper)
    ;
    local_590 = (Vector<unsigned_int,_4> *)&data2;
    do {
      tcu::Vector<unsigned_int,_4>::Vector(local_590);
      local_590 = local_590 + 1;
    } while (local_590 != (Vector<unsigned_int,_4> *)(data[0x42].m_data + 2));
    glu::CallLogWrapper::glReadBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8ce0);
    glu::CallLogWrapper::glReadPixels
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0,0,8,8,0x8d99,0x1405,&data2);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8c8e,this->xfb_buffer_[0]);
    local_4f0 = (uint *)glu::CallLogWrapper::glMapBufferRange
                                  (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                                    super_CallLogWrapper,0x8c8e,0,0xc,1);
    tcu::Vector<unsigned_int,_4>::Vector(&local_500,*local_4f0);
    data[0x3f].m_data[2] = local_500.m_data[0];
    data[0x3f].m_data[3] = local_500.m_data[1];
    data[0x40].m_data[0] = local_500.m_data[2];
    data[0x40].m_data[1] = local_500.m_data[3];
    tcu::Vector<unsigned_int,_4>::Vector(&local_510,local_4f0[1]);
    data[0x40].m_data[2] = local_510.m_data[0];
    data[0x40].m_data[3] = local_510.m_data[1];
    data[0x41].m_data[0] = local_510.m_data[2];
    data[0x41].m_data[1] = local_510.m_data[3];
    tcu::Vector<unsigned_int,_4>::Vector(&local_520,local_4f0[2]);
    data[0x41].m_data[2] = local_520.m_data[0];
    data[0x41].m_data[3] = local_520.m_data[1];
    data[0x42].m_data[0] = local_520.m_data[2];
    data[0x42].m_data[1] = local_520.m_data[3];
    bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                      (&this->super_SACSubcaseBase,0x43,(UVec4 *)&data2,100);
    if (bVar1) {
      glu::CallLogWrapper::glUnmapBuffer
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8c8e);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8c8e,0);
      glu::CallLogWrapper::glReadBuffer
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8ce1);
      glu::CallLogWrapper::glReadPixels
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,0,8,8,0x8d99,0x1405,&data2);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8c8e,this->xfb_buffer_[1]);
      local_4f0 = (uint *)glu::CallLogWrapper::glMapBufferRange
                                    (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper
                                      .super_CallLogWrapper,0x8c8e,0,0xc,1);
      tcu::Vector<unsigned_int,_4>::Vector(&local_534,*local_4f0);
      data[0x3f].m_data[2] = local_534.m_data[0];
      data[0x3f].m_data[3] = local_534.m_data[1];
      data[0x40].m_data[0] = local_534.m_data[2];
      data[0x40].m_data[1] = local_534.m_data[3];
      tcu::Vector<unsigned_int,_4>::Vector(&local_544,local_4f0[1]);
      data[0x40].m_data[2] = local_544.m_data[0];
      data[0x40].m_data[3] = local_544.m_data[1];
      data[0x41].m_data[0] = local_544.m_data[2];
      data[0x41].m_data[1] = local_544.m_data[3];
      tcu::Vector<unsigned_int,_4>::Vector(&local_554,local_4f0[2]);
      data[0x41].m_data[2] = local_554.m_data[0];
      data[0x41].m_data[3] = local_554.m_data[1];
      data[0x42].m_data[0] = local_554.m_data[2];
      data[0x42].m_data[1] = local_554.m_data[3];
      bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                        (&this->super_SACSubcaseBase,0x43,(UVec4 *)&data2,0x21);
      if (bVar1) {
        glu::CallLogWrapper::glUnmapBuffer
                  (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8c8e);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8c8e,0);
        bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                          (&this->super_SACSubcaseBase,this->counter_buffer_,0x20,0xa7);
        if (bVar1) {
          bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                            (&this->super_SACSubcaseBase,this->counter_buffer_,0x80,0x21);
          if (bVar1) {
            this_local = (AdvancedUsageMultiStage *)0x0;
          }
          else {
            this_local = (AdvancedUsageMultiStage *)&DAT_ffffffffffffffff;
          }
        }
        else {
          this_local = (AdvancedUsageMultiStage *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (AdvancedUsageMultiStage *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (AdvancedUsageMultiStage *)&DAT_ffffffffffffffff;
    }
    local_524 = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0);
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{

		GLint p1, p2, p3, p4;
		glGetIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTER_BUFFERS, &p1);
		glGetIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTERS, &p2);
		glGetIntegerv(GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS, &p3);
		glGetIntegerv(GL_MAX_FRAGMENT_ATOMIC_COUNTERS, &p4);
		if (p1 < 8 || p2 < 2 || p3 < 8 || p4 < 2)
		{
			OutputNotSupported("GL_MAX_FRAGMENT/VERTEX_ATOMIC_COUNTER_BUFFERS or"
							   "GL_MAX_FRAGMENT/VERTEX_ATOMIC_COUNTERS are less than required");
			return NOT_SUPPORTED;
		}

		// create program
		const char* src_vs =
			"#version 310 es" NL "layout(location = 0) in vec4 i_vertex;" NL "flat out uint o_atomic_inc;" NL
			"flat out uint o_atomic_dec;" NL "layout(binding = 1, offset = 16) uniform atomic_uint ac_counter_inc;" NL
			"layout(binding = 7, offset = 128) uniform atomic_uint ac_counter_dec;" NL "void main() {" NL
			"  gl_Position = i_vertex;" NL "  o_atomic_inc = atomicCounterIncrement(ac_counter_inc);" NL
			"  o_atomic_dec = atomicCounterDecrement(ac_counter_dec);" NL "}";
		const char* src_fs = "#version 310 es" NL "layout(location = 0) out uvec4 o_color[2];" NL
							 "layout(binding = 1, offset = 16) uniform atomic_uint ac_counter_inc;" NL
							 "layout(binding = 7, offset = 128) uniform atomic_uint ac_counter_dec;" NL
							 "void main() {" NL "  o_color[0] = uvec4(atomicCounterIncrement(ac_counter_inc));" NL
							 "  o_color[1] = uvec4(atomicCounterDecrement(ac_counter_dec));" NL "}";
		prog_				   = CreateProgram(src_vs, src_fs, false);
		const char* xfb_var[2] = { "o_atomic_inc", "o_atomic_dec" };
		glTransformFeedbackVaryings(prog_, 2, xfb_var, GL_SEPARATE_ATTRIBS);
		LinkProgram(prog_);

		// create atomic counter buffer
		std::vector<GLuint> init_data(256, 100);
		glGenBuffers(1, &counter_buffer_);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, (GLsizeiptr)(init_data.size() * sizeof(GLuint)), &init_data[0],
					 GL_DYNAMIC_COPY);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		// create transform feedback buffers
		glGenBuffers(2, xfb_buffer_);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_buffer_[0]);
		glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 1000, NULL, GL_STREAM_COPY);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_buffer_[1]);
		glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 1000, NULL, GL_STREAM_COPY);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);

		// create render targets
		const int s = 8;
		glGenTextures(2, rt_);
		for (int i = 0; i < 2; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, rt_[i]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_R32UI, s, s, 0, GL_RED_INTEGER, GL_UNSIGNED_INT, NULL);
			glBindTexture(GL_TEXTURE_2D, 0);
		}

		// create fbo
		glGenFramebuffers(1, &fbo_);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, rt_[0], 0);
		glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT1, GL_TEXTURE_2D, rt_[1], 0);
		const GLenum draw_buffers[2] = { GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1 };
		glDrawBuffers(2, draw_buffers);
		glBindFramebuffer(GL_FRAMEBUFFER, 0);

		// create geometry
		CreateTriangle(&vao_, &vbo_, NULL);

		// draw
		glBindBufferRange(GL_ATOMIC_COUNTER_BUFFER, 1, counter_buffer_, 16, 32);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 7, counter_buffer_);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, xfb_buffer_[0]);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 1, xfb_buffer_[1]);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		glViewport(0, 0, s, s);
		glUseProgram(prog_);
		glBindVertexArray(vao_);
		glBeginTransformFeedback(GL_TRIANGLES);
		glDrawArrays(GL_TRIANGLES, 0, 3);
		glEndTransformFeedback();

		// validate
		UVec4 data[s * s + 3];
		glReadBuffer(GL_COLOR_ATTACHMENT0);
		glReadPixels(0, 0, s, s, GL_RGBA_INTEGER, GL_UNSIGNED_INT, data);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_buffer_[0]);
		GLuint* data2;
		data2 = static_cast<GLuint*>(
			glMapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 3 * sizeof(GLuint), GL_MAP_READ_BIT));
		data[s * s]		= UVec4(data2[0]);
		data[s * s + 1] = UVec4(data2[1]);
		data[s * s + 2] = UVec4(data2[2]);
		if (!CheckCounterValues(s * s + 3, data, 100))
			return ERROR;
		glUnmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);

		glReadBuffer(GL_COLOR_ATTACHMENT1);
		glReadPixels(0, 0, s, s, GL_RGBA_INTEGER, GL_UNSIGNED_INT, data);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_buffer_[1]);
		data2 = static_cast<GLuint*>(
			glMapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 3 * sizeof(GLuint), GL_MAP_READ_BIT));
		data[s * s]		= UVec4(data2[0]);
		data[s * s + 1] = UVec4(data2[1]);
		data[s * s + 2] = UVec4(data2[2]);
		if (!CheckCounterValues(s * s + 3, data, 33))
			return ERROR;
		glUnmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);

		if (!CheckFinalCounterValue(counter_buffer_, 32, 167))
			return ERROR;
		if (!CheckFinalCounterValue(counter_buffer_, 128, 33))
			return ERROR;

		return NO_ERROR;
	}